

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_field.cpp
# Opt level: O0

void __thiscall Multi_Field_properties::test_method(Multi_Field_properties *this)

{
  Multi_Field_properties *this_local;
  
  test_multi_field_properties<Gudhi::persistence_fields::Multi_field_element_with_small_characteristics<5u,13u,unsigned_int,void>>
            ();
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(Multi_Field_properties) {
  test_multi_field_properties<Multi_field_element_with_small_characteristics<5, 13> >();
#ifdef PM_GMP_FOUND
  test_multi_field_properties<Multi_field_element<5, 13> >();

  Multi_field_element<3, 30> mb1(2);
  Multi_field_element_with_small_characteristics<3, 30> mb2(2);

  BOOST_CHECK_EQUAL(mb1.get_characteristic(), mb2.get_characteristic());  // == 3234846615
  BOOST_CHECK_EQUAL(mb1.get_partial_inverse(35).first.get_value(),
                    mb2.get_partial_inverse(35).first.get_value());  // == 2033332158
#endif
}